

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall Node::addDestNode(Node *this,Node *n)

{
  pointer *pppNVar1;
  iterator __position;
  Node *local_8;
  
  __position._M_current =
       (this->_nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = n;
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&this->_nodes,__position,&local_8);
  }
  else {
    *__position._M_current = n;
    pppNVar1 = &(this->_nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

void Node::addDestNode(Node &n)
{
    _nodes.push_back(&n);
}